

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test::
testBody(TEST_CommandLineTestRunner_NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid_Test
         *this)

{
  int iVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestRegistry *registry;
  char *argv [2];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  
  argv[0] = "tests.exe";
  argv[1] = "-fdskjnfkds";
  registry = &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry;
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            (&commandLineTestRunner,2,argv,registry);
  CommandLineTestRunner::runAllTestsMain(&commandLineTestRunner.super_CommandLineTestRunner);
  pUVar2 = UtestShell::getCurrent();
  iVar1 = TestRegistry::countPlugins(registry);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,(long)iVar1,"LONGS_EQUAL(0, registry.countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0x8c,pTVar3);
  CommandLineTestRunner::~CommandLineTestRunner(&commandLineTestRunner.super_CommandLineTestRunner);
  return;
}

Assistant:

TEST(CommandLineTestRunner, NoPluginsAreInstalledAtTheEndOfARunWhenTheArgumentsAreInvalid)
{
    const char* argv[] = { "tests.exe", "-fdskjnfkds"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    LONGS_EQUAL(0, registry.countPlugins());

}